

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

float linb::any_cast<float>(any *operand)

{
  float *pfVar1;
  undefined8 *puVar2;
  
  pfVar1 = any_cast<float>(operand);
  if (pfVar1 != (float *)0x0) {
    return *pfVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_0010cc10;
  __cxa_throw(puVar2,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

inline ValueType any_cast(any& operand)
{
    auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
#ifndef ANY_IMPL_NO_EXCEPTIONS
    if(p == nullptr) throw bad_any_cast();
#endif
    return *p;
}